

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O0

void __thiscall
Js::ScriptFunctionWithInlineCache::AllocateInlineCache(ScriptFunctionWithInlineCache *this)

{
  code *pcVar1;
  ThreadContext *pTVar2;
  ThreadContext *pTVar3;
  bool bVar4;
  PropertyId PVar5;
  void ***pppvVar6;
  undefined4 *puVar7;
  FunctionBody *this_00;
  Recycler *pRVar8;
  uchar *puVar9;
  InlineCacheAllocator *pIVar10;
  InlineCache *pIVar11;
  PropertyRecord *pPVar12;
  ScriptContext *pSVar13;
  CacheAllocator *pCVar14;
  void *pvVar15;
  TrackAllocData local_160;
  code *local_138;
  undefined8 local_130;
  TrackAllocData local_128;
  uint local_fc;
  uint local_f8;
  uint rootObjectStoreInlineCacheEnd;
  uint rootObjectLoadMethodInlineCacheEnd;
  uint rootObjectLoadInlineCacheEnd;
  ThreadContext *threadContext;
  RootObjectBase *rootObject;
  undefined8 local_d8;
  TrackAllocData local_d0;
  uint local_a8;
  uint local_a4;
  uint plainInlineCacheEnd;
  uint i;
  undefined8 local_98;
  TrackAllocData local_90;
  code *local_68;
  undefined8 local_60;
  TrackAllocData local_58;
  void **local_30;
  void **inlineCaches;
  ScriptContext *scriptContext;
  FunctionBody *functionBody;
  uint totalCacheCount;
  uint isInstInlineCacheStart;
  ScriptFunctionWithInlineCache *this_local;
  
  _totalCacheCount = this;
  pppvVar6 = Memory::WriteBarrierPtr::operator_cast_to_void___
                       ((WriteBarrierPtr *)&this->m_inlineCaches);
  if (*pppvVar6 != (void **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                ,0x2d8,"(this->m_inlineCaches == nullptr)",
                                "this->m_inlineCaches == nullptr");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  functionBody._4_4_ = GetInlineCacheCount(this);
  functionBody._0_4_ = functionBody._4_4_ + this->isInstInlineCacheCount;
  scriptContext = (ScriptContext *)JavascriptFunction::GetFunctionBody((JavascriptFunction *)this);
  if ((uint)functionBody != 0) {
    this_00 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)this);
    inlineCaches = (void **)FunctionProxy::GetScriptContext((FunctionProxy *)this_00);
    pRVar8 = ScriptContext::GetRecycler((ScriptContext *)inlineCaches);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_58,(type_info *)&void*::typeinfo,0,(ulong)(uint)functionBody,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
               ,0x2e2);
    pRVar8 = Memory::Recycler::TrackAllocInfo(pRVar8,&local_58);
    local_68 = Memory::Recycler::AllocZero;
    local_60 = 0;
    local_30 = Memory::AllocateArray<Memory::Recycler,void*,false>
                         ((Memory *)pRVar8,(Recycler *)Memory::Recycler::AllocZero,0,
                          (ulong)(uint)functionBody);
    pRVar8 = ScriptContext::GetRecycler((ScriptContext *)inlineCaches);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_90,(type_info *)&unsigned_char::typeinfo,0,(ulong)(uint)functionBody,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
               ,0x2e5);
    pRVar8 = Memory::Recycler::TrackAllocInfo(pRVar8,&local_90);
    _plainInlineCacheEnd = Memory::Recycler::AllocLeafZero;
    local_98 = 0;
    puVar9 = Memory::AllocateArray<Memory::Recycler,unsigned_char,false>
                       ((Memory *)pRVar8,(Recycler *)Memory::Recycler::AllocLeafZero,0,
                        (ulong)(uint)functionBody);
    Memory::WriteBarrierPtr<unsigned_char>::operator=(&this->m_inlineCacheTypes,puVar9);
    local_a4 = 0;
    local_a8 = this->rootObjectLoadInlineCacheStart;
    for (; local_a4 < local_a8; local_a4 = local_a4 + 1) {
      pIVar10 = ScriptContext::GetInlineCacheAllocator((ScriptContext *)inlineCaches);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_d0,(type_info *)&InlineCache::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                 ,0x2ed);
      pIVar10 = (InlineCacheAllocator *)
                Memory::ArenaAllocatorBase<Memory::InlineCacheFreeListPolicy,_5UL,_true,_1024UL>::
                TrackAllocInfo(&pIVar10->
                                super_ArenaAllocatorBase<Memory::InlineCacheFreeListPolicy,_5UL,_true,_1024UL>
                               ,&local_d0);
      rootObject = (RootObjectBase *)Memory::InlineCacheAllocator::AllocZero;
      local_d8 = 0;
      pIVar11 = (InlineCache *)new<Memory::InlineCacheAllocator>(0x20,pIVar10,0xa3a9c0);
      InlineCache::InlineCache(pIVar11);
      local_30[local_a4] = pIVar11;
    }
    threadContext = (ThreadContext *)FunctionBody::GetRootObject((FunctionBody *)scriptContext);
    _rootObjectLoadMethodInlineCacheEnd =
         ScriptContext::GetThreadContext((ScriptContext *)inlineCaches);
    rootObjectStoreInlineCacheEnd = this->rootObjectLoadMethodInlineCacheStart;
    for (; pTVar3 = threadContext, pTVar2 = _rootObjectLoadMethodInlineCacheEnd,
        local_a4 < rootObjectStoreInlineCacheEnd; local_a4 = local_a4 + 1) {
      PVar5 = FunctionBody::GetPropertyIdFromCacheId((FunctionBody *)scriptContext,local_a4);
      pPVar12 = ThreadContext::GetPropertyName(pTVar2,PVar5);
      pIVar11 = RootObjectBase::GetInlineCache((RootObjectBase *)pTVar3,pPVar12,false,false);
      local_30[local_a4] = pIVar11;
    }
    local_f8 = this->rootObjectStoreInlineCacheStart;
    for (; pTVar3 = threadContext, pTVar2 = _rootObjectLoadMethodInlineCacheEnd, local_a4 < local_f8
        ; local_a4 = local_a4 + 1) {
      PVar5 = FunctionBody::GetPropertyIdFromCacheId((FunctionBody *)scriptContext,local_a4);
      pPVar12 = ThreadContext::GetPropertyName(pTVar2,PVar5);
      pIVar11 = RootObjectBase::GetInlineCache((RootObjectBase *)pTVar3,pPVar12,true,false);
      local_30[local_a4] = pIVar11;
    }
    local_fc = functionBody._4_4_;
    for (; pTVar3 = threadContext, pTVar2 = _rootObjectLoadMethodInlineCacheEnd, local_a4 < local_fc
        ; local_a4 = local_a4 + 1) {
      PVar5 = FunctionBody::GetPropertyIdFromCacheId((FunctionBody *)scriptContext,local_a4);
      pPVar12 = ThreadContext::GetPropertyName(pTVar2,PVar5);
      pIVar11 = RootObjectBase::GetInlineCache((RootObjectBase *)pTVar3,pPVar12,false,true);
      local_30[local_a4] = pIVar11;
    }
    for (; local_a4 < (uint)functionBody; local_a4 = local_a4 + 1) {
      pSVar13 = FunctionProxy::GetScriptContext((FunctionProxy *)scriptContext);
      pCVar14 = ScriptContext::GetIsInstInlineCacheAllocator(pSVar13);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_128,(type_info *)&IsInstInlineCache::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                 ,0x30a);
      pCVar14 = (CacheAllocator *)
                Memory::ArenaAllocatorBase<Memory::StandAloneFreeListPolicy,_4UL,_false,_0UL>::
                TrackAllocInfo(&pCVar14->
                                super_ArenaAllocatorBase<Memory::StandAloneFreeListPolicy,_4UL,_false,_0UL>
                               ,&local_128);
      local_138 = Memory::CacheAllocator::AllocZero;
      local_130 = 0;
      pvVar15 = new<Memory::CacheAllocator>(0x20,pCVar14,0xa3a700);
      local_30[local_a4] = pvVar15;
    }
    pSVar13 = FunctionProxy::GetScriptContext((FunctionProxy *)scriptContext);
    pRVar8 = ScriptContext::GetRecycler(pSVar13);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_160,(type_info *)&unsigned_char::typeinfo,0,(ulong)(uint)functionBody,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
               ,0x30e);
    pRVar8 = Memory::Recycler::TrackAllocInfo(pRVar8,&local_160);
    puVar9 = Memory::AllocateArray<Memory::Recycler,unsigned_char,false>
                       ((Memory *)pRVar8,(Recycler *)Memory::Recycler::AllocLeafZero,0,
                        (ulong)(uint)functionBody);
    Memory::WriteBarrierPtr<unsigned_char>::operator=(&this->m_inlineCacheTypes,puVar9);
    Memory::WriteBarrierPtr<void_*>::operator=(&this->m_inlineCaches,local_30);
  }
  return;
}

Assistant:

void ScriptFunctionWithInlineCache::AllocateInlineCache()
    {
        Assert(this->m_inlineCaches == nullptr);
        uint isInstInlineCacheStart = this->GetInlineCacheCount();
        uint totalCacheCount = isInstInlineCacheStart + isInstInlineCacheCount;
        Js::FunctionBody* functionBody = this->GetFunctionBody();

        if (totalCacheCount != 0)
        {
            // Root object inline cache are not leaf
            Js::ScriptContext* scriptContext = this->GetFunctionBody()->GetScriptContext();
            void ** inlineCaches = RecyclerNewArrayZ(scriptContext->GetRecycler() ,
                void*, totalCacheCount);
#if DBG
            this->m_inlineCacheTypes = RecyclerNewArrayLeafZ(scriptContext->GetRecycler(),
                byte, totalCacheCount);
#endif
            uint i = 0;
            uint plainInlineCacheEnd = rootObjectLoadInlineCacheStart;
            __analysis_assume(plainInlineCacheEnd <= totalCacheCount);
            for (; i < plainInlineCacheEnd; i++)
            {
                inlineCaches[i] = AllocatorNewZ(InlineCacheAllocator,
                    scriptContext->GetInlineCacheAllocator(), InlineCache);
            }
            Js::RootObjectBase * rootObject = functionBody->GetRootObject();
            ThreadContext * threadContext = scriptContext->GetThreadContext();
            uint rootObjectLoadInlineCacheEnd = rootObjectLoadMethodInlineCacheStart;
            __analysis_assume(rootObjectLoadInlineCacheEnd <= totalCacheCount);
            for (; i < rootObjectLoadInlineCacheEnd; i++)
            {
                inlineCaches[i] = rootObject->GetInlineCache(
                    threadContext->GetPropertyName(functionBody->GetPropertyIdFromCacheId(i)), false, false);
            }
            uint rootObjectLoadMethodInlineCacheEnd = rootObjectStoreInlineCacheStart;
            __analysis_assume(rootObjectLoadMethodInlineCacheEnd <= totalCacheCount);
            for (; i < rootObjectLoadMethodInlineCacheEnd; i++)
            {
                inlineCaches[i] = rootObject->GetInlineCache(
                    threadContext->GetPropertyName(functionBody->GetPropertyIdFromCacheId(i)), true, false);
            }
            uint rootObjectStoreInlineCacheEnd = isInstInlineCacheStart;
            __analysis_assume(rootObjectStoreInlineCacheEnd <= totalCacheCount);
            for (; i < rootObjectStoreInlineCacheEnd; i++)
            {
#pragma prefast(suppress:6386, "The analysis assume didn't help prefast figure out this is in range")
                inlineCaches[i] = rootObject->GetInlineCache(
                    threadContext->GetPropertyName(functionBody->GetPropertyIdFromCacheId(i)), false, true);
            }
            for (; i < totalCacheCount; i++)
            {
                inlineCaches[i] = AllocatorNewStructZ(CacheAllocator,
                    functionBody->GetScriptContext()->GetIsInstInlineCacheAllocator(), IsInstInlineCache);
            }
#if DBG
            this->m_inlineCacheTypes = RecyclerNewArrayLeafZ(functionBody->GetScriptContext()->GetRecycler(),
                byte, totalCacheCount);
#endif
            this->m_inlineCaches = inlineCaches;
        }
    }